

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O0

void subflow_task(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  Executor *this;
  ContextOptions *pCVar2;
  uint in_EDI;
  double __x;
  double __x_00;
  type *anon_var_0_1;
  ResultBuilder DOCTEST_RB_1;
  int i_1;
  type *anon_var_0;
  ResultBuilder DOCTEST_RB;
  int i;
  Executor executor;
  Taskflow taskflow;
  nullptr_t in_stack_fffffffffffffc58;
  undefined6 in_stack_fffffffffffffc60;
  byte in_stack_fffffffffffffc66;
  byte in_stack_fffffffffffffc67;
  future<void> *this_00;
  Enum in_stack_fffffffffffffc7c;
  Taskflow *in_stack_fffffffffffffc80;
  Executor *in_stack_fffffffffffffc90;
  TestCaseData *in_stack_fffffffffffffca0;
  FlowBuilder *in_stack_fffffffffffffca8;
  int local_2dc;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffd48;
  TestCaseData *in_stack_fffffffffffffd50;
  Executor *in_stack_fffffffffffffd58;
  int local_228;
  future<void> local_218 [33];
  uint local_4;
  
  local_4 = in_EDI;
  tf::Taskflow::Taskflow(in_stack_fffffffffffffc80);
  this = (Executor *)(ulong)local_4;
  this_00 = local_218;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT17(in_stack_fffffffffffffc67,
                      CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)),
             in_stack_fffffffffffffc58);
  tf::Executor::Executor
            (in_stack_fffffffffffffd58,(size_t)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11d213);
  for (local_228 = 0; local_228 < 100; local_228 = local_228 + 1) {
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:239:22),_nullptr>
              (in_stack_fffffffffffffca8,(anon_class_1_0_00000001 *)in_stack_fffffffffffffca0);
  }
  pCVar2 = doctest::getContextOptions();
  if ((pCVar2->no_throw & 1U) == 0) {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,(char *)this_00,
               (int)((ulong)this >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffc67,
                                CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)),"x",
               (char *)in_stack_fffffffffffffc90);
    tf::Executor::run(this,(Taskflow *)
                           CONCAT17(in_stack_fffffffffffffc67,
                                    CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)));
    std::future<void>::get(this_00);
    tf::Future<void>::~Future
              ((Future<void> *)
               CONCAT17(in_stack_fffffffffffffc67,
                        CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)));
    doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffd50,__x);
    if ((extraout_AL & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    in_stack_fffffffffffffc67 = extraout_AL;
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)
               CONCAT17(extraout_AL,CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11d451);
  }
  tf::Taskflow::clear((Taskflow *)0x11d476);
  for (local_2dc = 0; local_2dc < 100; local_2dc = local_2dc + 1) {
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:251:22),_nullptr>
              (in_stack_fffffffffffffca8,(anon_class_1_0_00000001 *)in_stack_fffffffffffffca0);
  }
  pCVar2 = doctest::getContextOptions();
  if ((pCVar2->no_throw & 1U) == 0) {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,(char *)this_00,
               (int)((ulong)this >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffc67,
                                CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)),"y",
               (char *)in_stack_fffffffffffffc90);
    tf::Executor::run(this,(Taskflow *)
                           CONCAT17(in_stack_fffffffffffffc67,
                                    CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)));
    std::future<void>::get(this_00);
    tf::Future<void>::~Future
              ((Future<void> *)
               CONCAT17(in_stack_fffffffffffffc67,
                        CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)));
    doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffca0,__x_00);
    if ((extraout_AL_00 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    in_stack_fffffffffffffc66 = extraout_AL_00;
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)
               CONCAT17(in_stack_fffffffffffffc67,CONCAT16(extraout_AL_00,in_stack_fffffffffffffc60)
                       ));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11d656);
  }
  tf::Executor::~Executor(in_stack_fffffffffffffc90);
  tf::Taskflow::~Taskflow
            ((Taskflow *)
             CONCAT17(in_stack_fffffffffffffc67,
                      CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)));
  return;
}

Assistant:

void subflow_task(unsigned W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);
  
  // subflow work throws
  for(int i=0; i<100; i++) {
    taskflow.emplace([](tf::Subflow& sf){
      throw std::runtime_error("x");
      sf.emplace([](){});
      sf.emplace([](){ throw std::runtime_error("z"); });
    });
  }
  REQUIRE_THROWS_WITH_AS(executor.run(taskflow).get(), "x", std::runtime_error);

  taskflow.clear();
  
  // subflow's task throws
  for(int i=0; i<100; i++) {
    taskflow.emplace([](tf::Subflow& sf){
      sf.emplace([](){});
      sf.emplace([](){ throw std::runtime_error("y"); });
    });
  }
  REQUIRE_THROWS_WITH_AS(executor.run(taskflow).get(), "y", std::runtime_error);
}